

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::GenerateRegressionImages(cmCTestTestHandler *this,cmXMLWriter *xml,string *dart)

{
  char *pcVar1;
  pointer pcVar2;
  cmCTest *this_00;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  cmCTestTestHandler *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  unsigned_long length;
  uchar *puVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  ulong uVar15;
  bool bVar16;
  string k2;
  string cxml;
  string v2;
  ostringstream ostr;
  ifstream ifs;
  RegularExpression measurementfile;
  RegularExpression fourattributes;
  RegularExpression twoattributes;
  RegularExpression threeattributes;
  RegularExpression cdatastart;
  RegularExpression cdataend;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  long *local_968 [2];
  long local_958 [2];
  string local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  undefined1 local_908 [8];
  char *local_900;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8 [6];
  ios_base local_898 [264];
  undefined1 local_790 [112];
  ios_base local_720 [408];
  string local_588;
  uchar *local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  uchar *local_540;
  cmCTestTestHandler *local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_370.program = (char *)0x0;
  local_538 = this;
  cmsys::RegularExpression::compile
            (&local_370,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_2a0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_2a0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_440.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_440,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurement>"
            );
  local_1d0.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_1d0,
             "<DartMeasurement[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>[ \t\r\n]*<!\\[CDATA\\["
            );
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"]]>[ \t\r\n]*</DartMeasurement>");
  local_510.program = (char *)0x0;
  cmsys::RegularExpression::compile
            (&local_510,
             "<DartMeasurementFile[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*(name|type|encoding|compression)=\"([^\"]*)\"[ \t\r\n]*>([^<]*)</DartMeasurementFile>"
            );
  local_968[0] = local_958;
  pcVar2 = (dart->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_968,pcVar2,pcVar2 + dart->_M_string_length);
  pcVar1 = local_790 + 0x10;
  bVar16 = false;
  do {
    bVar6 = cmsys::RegularExpression::find(&local_370,(char *)local_968[0]);
    if (bVar6) {
      local_790._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
      cmXMLWriter::StartElement(xml,(string *)local_790);
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      if (local_370.startp[1] == (char *)0x0) {
        local_790._8_8_ = 0;
        local_790[0x10] = '\0';
        local_790._0_8_ = pcVar1;
      }
      else {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_790,local_370.startp[1],local_370.endp[1]);
      }
      uVar4 = local_790._0_8_;
      if (local_370.startp[2] == (char *)0x0) {
        local_908 = (undefined1  [8])local_8f8;
        local_900 = (char *)0x0;
        local_8f8[0]._M_allocated_capacity = local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_908 = (undefined1  [8])local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,local_370.startp[2],local_370.endp[2]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,(char *)uVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
      if (local_908 != (undefined1  [8])local_8f8) {
        operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      if (local_370.startp[3] == (char *)0x0) {
        local_790._8_8_ = 0;
        local_790[0x10] = '\0';
        local_790._0_8_ = pcVar1;
      }
      else {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_790,local_370.startp[3],local_370.endp[3]);
      }
      uVar4 = local_790._0_8_;
      if (local_370.startp[4] == (char *)0x0) {
        local_908 = (undefined1  [8])local_8f8;
        local_900 = (char *)0x0;
        local_8f8[0]._M_allocated_capacity = local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_908 = (undefined1  [8])local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,local_370.startp[4],local_370.endp[4]);
      }
      cmXMLWriter::Attribute<std::__cxx11::string>
                (xml,(char *)uVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
      if (local_908 != (undefined1  [8])local_8f8) {
        operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      local_790._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
      if (local_370.startp[5] == (char *)0x0) {
        local_908 = (undefined1  [8])local_8f8;
        local_900 = (char *)0x0;
        local_8f8[0]._M_allocated_capacity = local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
      }
      else {
        local_908 = (undefined1  [8])local_8f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_908,local_370.startp[5],local_370.endp[5]);
      }
      cmXMLWriter::StartElement(xml,(string *)local_790);
      cmXMLWriter::Content<std::__cxx11::string>
                (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908)
      ;
      cmXMLWriter::EndElement(xml);
      if (local_908 != (undefined1  [8])local_8f8) {
        operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
      }
      if ((char *)local_790._0_8_ != pcVar1) {
        operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
      }
      cmXMLWriter::EndElement(xml);
      uVar15 = (long)local_370.startp[0] - (long)local_370.searchstring;
LAB_002f49f5:
      std::__cxx11::string::erase((ulong)local_968,uVar15);
      bVar6 = bVar16;
    }
    else {
      bVar6 = cmsys::RegularExpression::find(&local_2a0,(char *)local_968[0]);
      if (bVar6) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.startp[1],local_2a0.endp[1]);
        }
        uVar4 = local_790._0_8_;
        if (local_2a0.startp[2] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_2a0.startp[2],local_2a0.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.startp[3],local_2a0.endp[3]);
        }
        uVar4 = local_790._0_8_;
        if (local_2a0.startp[4] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_2a0.startp[4],local_2a0.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_2a0.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_2a0.startp[5],local_2a0.endp[5]);
        }
        uVar4 = local_790._0_8_;
        if (local_2a0.startp[6] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_2a0.startp[6],local_2a0.endp[6]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        if (local_370.startp[7] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_370.startp[7],local_370.endp[7]);
        }
        cmXMLWriter::StartElement(xml,(string *)local_790);
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_908);
        cmXMLWriter::EndElement(xml);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        uVar15 = (long)local_2a0.startp[0] - (long)local_2a0.searchstring;
        goto LAB_002f49f5;
      }
      bVar6 = cmsys::RegularExpression::find(&local_440,(char *)local_968[0]);
      if (bVar6) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.startp[1],local_440.endp[1]);
        }
        uVar4 = local_790._0_8_;
        if (local_440.startp[2] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_440.startp[2],local_440.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.startp[3],local_440.endp[3]);
        }
        uVar4 = local_790._0_8_;
        if (local_440.startp[4] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_440.startp[4],local_440.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.startp[5],local_440.endp[5]);
        }
        uVar4 = local_790._0_8_;
        if (local_440.startp[6] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_440.startp[6],local_440.endp[6]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_440.startp[7] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_440.startp[7],local_440.endp[7]);
        }
        uVar4 = local_790._0_8_;
        if (local_440.startp[8] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_440.startp[8],local_440.endp[8]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        if (local_370.startp[9] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_370.startp[9],local_370.endp[9]);
        }
        cmXMLWriter::StartElement(xml,(string *)local_790);
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_908);
        cmXMLWriter::EndElement(xml);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        uVar15 = (long)local_440.startp[0] - (long)local_440.searchstring;
        goto LAB_002f49f5;
      }
      bVar6 = cmsys::RegularExpression::find(&local_1d0,(char *)local_968[0]);
      if ((bVar6) &&
         (bVar6 = cmsys::RegularExpression::find(&local_100,(char *)local_968[0]), bVar6)) {
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_1d0.startp[1] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_1d0.startp[1],local_1d0.endp[1]);
        }
        uVar4 = local_790._0_8_;
        if (local_1d0.startp[2] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_1d0.startp[2],local_1d0.endp[2]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        if (local_1d0.startp[3] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_1d0.startp[3],local_1d0.endp[3]);
        }
        uVar4 = local_790._0_8_;
        if (local_1d0.startp[4] == (char *)0x0) {
          local_908 = (undefined1  [8])local_8f8;
          local_900 = (char *)0x0;
          local_8f8[0]._M_allocated_capacity =
               local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_908 = (undefined1  [8])local_8f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_908,local_1d0.startp[4],local_1d0.endp[4]);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,(char *)uVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_908);
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
        }
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        local_790._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
        cmXMLWriter::StartElement(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        std::__cxx11::string::substr((ulong)local_790,(ulong)local_968);
        cmXMLWriter::CData(xml,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        uVar15 = (long)local_1d0.startp[0] - (long)local_1d0.searchstring;
        goto LAB_002f49f5;
      }
      bVar7 = cmsys::RegularExpression::find(&local_510,(char *)local_968[0]);
      bVar6 = true;
      if (bVar7) {
        if (local_510.startp[5] == (char *)0x0) {
          local_790._8_8_ = 0;
          local_790[0x10] = '\0';
          local_790._0_8_ = pcVar1;
        }
        else {
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_790,local_510.startp[5],local_510.endp[5]);
        }
        cmCTest::CleanString(&local_588,(string *)local_790);
        if ((char *)local_790._0_8_ != pcVar1) {
          operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
        }
        bVar6 = cmsys::SystemTools::FileExists(local_588._M_dataplus._M_p);
        if (bVar6) {
          length = cmsys::SystemTools::FileLength(&local_588);
          if (length == 0) {
            if (local_510.startp[1] == (char *)0x0) {
              local_790._8_8_ = 0;
              local_790[0x10] = '\0';
              local_790._0_8_ = pcVar1;
            }
            else {
              local_790._0_8_ = pcVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_790,local_510.startp[1],local_510.endp[1]);
            }
            if (local_510.startp[2] == (char *)0x0) {
              local_908 = (undefined1  [8])local_8f8;
              local_900 = (char *)0x0;
              local_8f8[0]._M_allocated_capacity =
                   local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_908 = (undefined1  [8])local_8f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_908,local_510.startp[2],local_510.endp[2]);
            }
            if (local_510.startp[3] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.startp[3],local_510.endp[3]);
            }
            if (local_510.startp[4] == (char *)0x0) {
              local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
              local_928._M_string_length = 0;
              local_928.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_928,local_510.startp[4],local_510.endp[4]);
            }
            cmsys::SystemTools::LowerCase(&local_948,(string *)local_790);
            iVar8 = std::__cxx11::string::compare((char *)&local_948);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1
                             );
            }
            if (iVar8 == 0) {
              std::__cxx11::string::_M_replace((ulong)local_908,0,local_900,0x636129);
            }
            cmsys::SystemTools::LowerCase(&local_948,&local_988);
            iVar8 = std::__cxx11::string::compare((char *)&local_948);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1
                             );
            }
            if (iVar8 == 0) {
              std::__cxx11::string::_M_replace
                        ((ulong)&local_928,0,(char *)local_928._M_string_length,0x636129);
            }
            local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_948,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,&local_948);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1
                             );
            }
            cmXMLWriter::Attribute<std::__cxx11::string>
                      (xml,(char *)local_790._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_908);
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,local_988._M_dataplus._M_p,&local_928);
            cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x691dc2);
            local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"Value","");
            std::operator+(&local_530,"Image ",&local_588);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_530);
            local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
            psVar14 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_560.field_2._M_allocated_capacity = *psVar14;
              local_560.field_2._8_8_ = plVar12[3];
            }
            else {
              local_560.field_2._M_allocated_capacity = *psVar14;
              local_560._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_560._M_string_length = plVar12[1];
            *plVar12 = (long)psVar14;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            cmXMLWriter::StartElement(xml,&local_948);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&local_560);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_560._M_dataplus._M_p != &local_560.field_2) {
              operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_530._M_dataplus._M_p != &local_530.field_2) {
              operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_948._M_dataplus._M_p != &local_948.field_2) {
              operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1
                             );
            }
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_928._M_dataplus._M_p != &local_928.field_2) {
              operator_delete(local_928._M_dataplus._M_p,
                              CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                                       local_928.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_908 != (undefined1  [8])local_8f8) {
              operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
            }
            if ((char *)local_790._0_8_ != pcVar1) {
              operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1
                             );
            }
          }
          else {
            std::ifstream::ifstream(local_790,local_588._M_dataplus._M_p,_S_in);
            puVar9 = (uchar *)operator_new__(length + 1);
            std::istream::read(local_790,(long)puVar9);
            local_568 = (uchar *)operator_new__((long)(int)((double)(long)length * 1.5 + 5.0));
            local_540 = puVar9;
            sVar10 = cmsysBase64_Encode(puVar9,length,local_568,1);
            local_908 = (undefined1  [8])local_8f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_908,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,(string *)local_908);
            if (local_908 != (undefined1  [8])local_8f8) {
              operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
            }
            if (local_510.startp[1] == (char *)0x0) {
              local_908 = (undefined1  [8])local_8f8;
              local_900 = (char *)0x0;
              local_8f8[0]._M_allocated_capacity =
                   local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_908 = (undefined1  [8])local_8f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_908,local_510.startp[1],local_510.endp[1]);
            }
            auVar3 = local_908;
            if (local_510.startp[2] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.startp[2],local_510.endp[2]);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)auVar3,&local_988);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_908 != (undefined1  [8])local_8f8) {
              operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
            }
            if (local_510.startp[3] == (char *)0x0) {
              local_908 = (undefined1  [8])local_8f8;
              local_900 = (char *)0x0;
              local_8f8[0]._M_allocated_capacity =
                   local_8f8[0]._M_allocated_capacity & 0xffffffffffffff00;
            }
            else {
              local_908 = (undefined1  [8])local_8f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_908,local_510.startp[3],local_510.endp[3]);
            }
            auVar3 = local_908;
            if (local_510.startp[4] == (char *)0x0) {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              local_988._M_string_length = 0;
              local_988.field_2._M_local_buf[0] = '\0';
            }
            else {
              local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_988,local_510.startp[4],local_510.endp[4]);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,(char *)auVar3,&local_988);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            if (local_908 != (undefined1  [8])local_8f8) {
              operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_908);
            if (sVar10 != 0) {
              uVar15 = 0;
              do {
                local_988._M_dataplus._M_p._0_1_ = local_568[uVar15];
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_908,(char *)&local_988,1);
                if ((uVar15 != 0) && ((uVar15 / 0x3c) * 0x3c - uVar15 == 0)) {
                  std::ios::widen((char)*(undefined8 *)((long)local_908 + -0x18) + (char)local_908);
                  std::ostream::put((char)local_908);
                  std::ostream::flush();
                }
                uVar15 = uVar15 + 1;
              } while (sVar10 != uVar15);
            }
            local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"Value","");
            std::__cxx11::stringbuf::str();
            puVar9 = local_540;
            cmXMLWriter::StartElement(xml,&local_988);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&local_928);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_928._M_dataplus._M_p != &local_928.field_2) {
              operator_delete(local_928._M_dataplus._M_p,
                              CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                                       local_928.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_988._M_dataplus._M_p != &local_988.field_2) {
              operator_delete(local_988._M_dataplus._M_p,
                              CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                       local_988.field_2._M_local_buf[0]) + 1);
            }
            cmXMLWriter::EndElement(xml);
            operator_delete__(puVar9);
            operator_delete__(local_568);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_908);
            std::ios_base::~ios_base(local_898);
            std::ifstream::~ifstream(local_790);
          }
        }
        else {
          if (local_510.startp[1] == (char *)0x0) {
            local_790._8_8_ = 0;
            local_790[0x10] = '\0';
            local_790._0_8_ = pcVar1;
          }
          else {
            local_790._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_790,local_510.startp[1],local_510.endp[1]);
          }
          iVar8 = std::__cxx11::string::compare(local_790);
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"NamedMeasurement","")
          ;
          cmXMLWriter::StartElement(xml,(string *)local_790);
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          if (local_510.startp[(ulong)(iVar8 != 0) * 2 + 2] == (char *)0x0) {
            local_790._8_8_ = 0;
            local_790[0x10] = '\0';
            local_790._0_8_ = pcVar1;
          }
          else {
            local_790._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_790,local_510.startp[(ulong)(iVar8 != 0) * 2 + 2],
                       local_510.endp[(ulong)(iVar8 != 0) * 2 + 2]);
          }
          cmXMLWriter::Attribute<std::__cxx11::string>
                    (xml,"name",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790)
          ;
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
          local_790._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"Value","");
          std::operator+(&local_988,"File ",&local_588);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_988);
          local_908 = (undefined1  [8])local_8f8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 == paVar13) {
            local_8f8[0]._0_8_ = paVar13->_M_allocated_capacity;
            local_8f8[0]._8_8_ = plVar12[3];
          }
          else {
            local_8f8[0]._0_8_ = paVar13->_M_allocated_capacity;
            local_908 = (undefined1  [8])*plVar12;
          }
          local_900 = (char *)plVar12[1];
          *plVar12 = (long)paVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          cmXMLWriter::StartElement(xml,(string *)local_790);
          cmXMLWriter::Content<std::__cxx11::string>
                    (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_908);
          cmXMLWriter::EndElement(xml);
          if (local_908 != (undefined1  [8])local_8f8) {
            operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_988._M_dataplus._M_p != &local_988.field_2) {
            operator_delete(local_988._M_dataplus._M_p,
                            CONCAT71(local_988.field_2._M_allocated_capacity._1_7_,
                                     local_988.field_2._M_local_buf[0]) + 1);
          }
          if ((char *)local_790._0_8_ != pcVar1) {
            operator_delete((void *)local_790._0_8_,CONCAT71(local_790._17_7_,local_790[0x10]) + 1);
          }
          cmXMLWriter::EndElement(xml);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_790);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_790,"File \"",6);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_790,local_588._M_dataplus._M_p,
                               local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar5 = local_538;
          this_00 = (local_538->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(this_00,2,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x844,(char *)local_908,(pcVar5->super_cmCTestGenericHandler).Quiet);
          if (local_908 != (undefined1  [8])local_8f8) {
            operator_delete((void *)local_908,local_8f8[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_790);
          std::ios_base::~ios_base(local_720);
        }
        std::__cxx11::string::erase
                  ((ulong)local_968,(long)local_510.startp[0] - (long)local_510.searchstring);
        bVar6 = bVar16;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
      }
    }
    bVar16 = bVar6;
    if (bVar6) {
      if (local_968[0] != local_958) {
        operator_delete(local_968[0],local_958[0] + 1);
      }
      if (local_510.program != (char *)0x0) {
        operator_delete__(local_510.program);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_1d0.program != (char *)0x0) {
        operator_delete__(local_1d0.program);
      }
      if (local_440.program != (char *)0x0) {
        operator_delete__(local_440.program);
      }
      if (local_2a0.program != (char *)0x0) {
        operator_delete__(local_2a0.program);
      }
      if (local_370.program != (char *)0x0) {
        operator_delete__(local_370.program);
      }
      return;
    }
  } while( true );
}

Assistant:

void cmCTestTestHandler::GenerateRegressionImages(cmXMLWriter& xml,
                                                  const std::string& dart)
{
  cmsys::RegularExpression twoattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression threeattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression fourattributes(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurement>");
  cmsys::RegularExpression cdatastart(
    "<DartMeasurement" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>" SPACE_REGEX "*<!\\[CDATA\\[");
  cmsys::RegularExpression cdataend("]]>" SPACE_REGEX "*</DartMeasurement>");
  cmsys::RegularExpression measurementfile(
    "<DartMeasurementFile" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*(name|type|encoding|compression)=\"([^\"]*)\"" SPACE_REGEX
    "*>([^<]*)</DartMeasurementFile>");

  bool done = false;
  std::string cxml = dart;
  while (!done) {
    if (twoattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(twoattributes.match(1).c_str(), twoattributes.match(2));
      xml.Attribute(twoattributes.match(3).c_str(), twoattributes.match(4));
      xml.Element("Value", twoattributes.match(5));
      xml.EndElement();
      cxml.erase(twoattributes.start(),
                 twoattributes.end() - twoattributes.start());
    } else if (threeattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(threeattributes.match(1).c_str(),
                    threeattributes.match(2));
      xml.Attribute(threeattributes.match(3).c_str(),
                    threeattributes.match(4));
      xml.Attribute(threeattributes.match(5).c_str(),
                    threeattributes.match(6));
      xml.Element("Value", twoattributes.match(7));
      xml.EndElement();
      cxml.erase(threeattributes.start(),
                 threeattributes.end() - threeattributes.start());
    } else if (fourattributes.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(fourattributes.match(1).c_str(), fourattributes.match(2));
      xml.Attribute(fourattributes.match(3).c_str(), fourattributes.match(4));
      xml.Attribute(fourattributes.match(5).c_str(), fourattributes.match(6));
      xml.Attribute(fourattributes.match(7).c_str(), fourattributes.match(8));
      xml.Element("Value", twoattributes.match(9));
      xml.EndElement();
      cxml.erase(fourattributes.start(),
                 fourattributes.end() - fourattributes.start());
    } else if (cdatastart.find(cxml) && cdataend.find(cxml)) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute(cdatastart.match(1).c_str(), cdatastart.match(2));
      xml.Attribute(cdatastart.match(3).c_str(), cdatastart.match(4));
      xml.StartElement("Value");
      xml.CData(
        cxml.substr(cdatastart.end(), cdataend.start() - cdatastart.end()));
      xml.EndElement(); // Value
      xml.EndElement(); // NamedMeasurement
      cxml.erase(cdatastart.start(), cdataend.end() - cdatastart.start());
    } else if (measurementfile.find(cxml)) {
      const std::string& filename =
        cmCTest::CleanString(measurementfile.match(5));
      if (cmSystemTools::FileExists(filename.c_str())) {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          std::string k1 = measurementfile.match(1);
          std::string v1 = measurementfile.match(2);
          std::string k2 = measurementfile.match(3);
          std::string v2 = measurementfile.match(4);
          if (cmSystemTools::LowerCase(k1) == "type") {
            v1 = "text/string";
          }
          if (cmSystemTools::LowerCase(k2) == "type") {
            v2 = "text/string";
          }

          xml.StartElement("NamedMeasurement");
          xml.Attribute(k1.c_str(), v1);
          xml.Attribute(k2.c_str(), v2);
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          cmsys::ifstream ifs(filename.c_str(), std::ios::in
#ifdef _WIN32
                                | std::ios::binary
#endif
                              );
          unsigned char* file_buffer = new unsigned char[len + 1];
          ifs.read(reinterpret_cast<char*>(file_buffer), len);
          unsigned char* encoded_buffer = new unsigned char[static_cast<int>(
            static_cast<double>(len) * 1.5 + 5.0)];

          size_t rlen =
            cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

          xml.StartElement("NamedMeasurement");
          xml.Attribute(measurementfile.match(1).c_str(),
                        measurementfile.match(2));
          xml.Attribute(measurementfile.match(3).c_str(),
                        measurementfile.match(4));
          xml.Attribute("encoding", "base64");
          std::ostringstream ostr;
          for (size_t cc = 0; cc < rlen; cc++) {
            ostr << encoded_buffer[cc];
            if (cc % 60 == 0 && cc) {
              ostr << std::endl;
            }
          }
          xml.Element("Value", ostr.str());
          xml.EndElement(); // NamedMeasurement
          delete[] file_buffer;
          delete[] encoded_buffer;
        }
      } else {
        int idx = 4;
        if (measurementfile.match(1) == "name") {
          idx = 2;
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", measurementfile.match(idx));
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "File \""
                             << filename << "\" not found." << std::endl,
                           this->Quiet);
      }
      cxml.erase(measurementfile.start(),
                 measurementfile.end() - measurementfile.start());
    } else {
      done = true;
    }
  }
}